

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

TreeOrError *
slang::syntax::SyntaxTree::fromFile(string_view path,SourceManager *sourceManager,Bag *options)

{
  bool bVar1;
  error_type *__x;
  undefined8 in_RCX;
  SourceManager *in_RDI;
  BufferOrError buffer;
  undefined1 in_stack_000008af;
  Bag *in_stack_000008b0;
  SourceManager *in_stack_000008b8;
  span<const_slang::SourceBuffer,_18446744073709551615UL> in_stack_000008c0;
  MacroList in_stack_000008e0;
  path *in_stack_fffffffffffffea0;
  unexpected_type<std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffea8;
  SourceBuffer *__first;
  span<slang::SourceBuffer,_18446744073709551615UL> *in_stack_fffffffffffffeb0;
  uint64_t in_stack_fffffffffffffec0;
  SourceLibrary *in_stack_fffffffffffffec8;
  SourceManager *this;
  path *in_stack_fffffffffffffef0;
  path *ppStack_108;
  SourceBuffer local_100;
  undefined4 local_cc;
  pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_> local_c8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_78 [6];
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this = in_RDI;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffef0,local_78,(format)((ulong)in_RCX >> 0x38));
  SourceManager::readSource(this,(path *)in_RDI,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0)
  ;
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffea0);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                    ((expected<slang::SourceBuffer,_std::error_code> *)0x1708d6);
  if (bVar1) {
    nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::value
              ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffea0);
    __first = &local_100;
    std::span<slang::SourceBuffer,_18446744073709551615UL>::span<slang::SourceBuffer_*>
              (in_stack_fffffffffffffeb0,__first,(size_type)in_stack_fffffffffffffea0);
    std::span<const_slang::SourceBuffer,_18446744073709551615UL>::
    span<slang::SourceBuffer,_18446744073709551615UL>
              ((span<const_slang::SourceBuffer,_18446744073709551615UL> *)in_stack_fffffffffffffeb0,
               (span<slang::SourceBuffer,_18446744073709551615UL> *)__first);
    std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
              ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
               0x1709f5);
    create(in_stack_000008b8,in_stack_000008c0,in_stack_000008b0,in_stack_000008e0,
           (bool)in_stack_000008af);
    nonstd::expected_lite::
    expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::expected<std::shared_ptr<slang::syntax::SyntaxTree>,_0>
              ((expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)ppStack_108,(shared_ptr<slang::syntax::SyntaxTree> *)in_stack_fffffffffffffef0);
    std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)0x170a48);
    in_stack_fffffffffffffea0 = ppStack_108;
  }
  else {
    __x = nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::error
                    ((expected<slang::SourceBuffer,_std::error_code> *)0x1708eb);
    std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>::
    pair<std::error_code_&,_std::basic_string_view<char,_std::char_traits<char>_>_&,_true>
              (local_c8,__x,&local_18);
    nonstd::expected_lite::
    make_unexpected<std::pair<std::error_code,std::basic_string_view<char,std::char_traits<char>>>>
              ((pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
               in_stack_fffffffffffffea0);
    nonstd::expected_lite::
    expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::
    expected<std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>,_0>
              ((expected<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  local_cc = 1;
  nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
            ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_fffffffffffffea0);
  return (TreeOrError *)this;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFile(std::string_view path, SourceManager& sourceManager,
                                             const Bag& options) {
    auto buffer = sourceManager.readSource(path, /* library */ nullptr);
    if (!buffer)
        return nonstd::make_unexpected(std::pair{buffer.error(), path});
    return create(sourceManager, std::span(&buffer.value(), 1), options, {}, false);
}